

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolTable.cpp
# Opt level: O3

bool __thiscall
SymbolTable::addEquation
          (SymbolTable *this,Identifier *name,int file,int section,size_t referenceIndex)

{
  char *pcVar1;
  bool bVar2;
  int *piVar3;
  mapped_type *pmVar4;
  SymbolKey key;
  int local_58;
  int local_54;
  SymbolKey local_50;
  
  local_58 = section;
  local_54 = file;
  bVar2 = isValidSymbolName(name);
  if ((!bVar2) || (bVar2 = symbolExists(this,name,file,section), bVar2)) {
    bVar2 = false;
  }
  else {
    pcVar1 = (name->_name)._M_dataplus._M_p;
    if (*pcVar1 == '@') {
      piVar3 = &local_58;
      if (pcVar1[1] == '@') {
        piVar3 = &local_54;
      }
    }
    else {
      local_58 = -1;
      piVar3 = &local_54;
    }
    *piVar3 = -1;
    SymbolKey::SymbolKey(&local_50,name,local_54,local_58);
    pmVar4 = std::
             map<SymbolKey,_SymbolTable::SymbolInfo,_std::less<SymbolKey>,_std::allocator<std::pair<const_SymbolKey,_SymbolTable::SymbolInfo>_>_>
             ::operator[](&this->symbols,&local_50);
    pmVar4->type = EquationSymbol;
    pmVar4->index = referenceIndex;
    this->equationsCount = this->equationsCount + 1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50.name._M_dataplus._M_p != &local_50.name.field_2) {
      operator_delete(local_50.name._M_dataplus._M_p,local_50.name.field_2._M_allocated_capacity + 1
                     );
    }
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool SymbolTable::addEquation(const Identifier& name, int file, int section, size_t referenceIndex)
{
	if (!isValidSymbolName(name))
		return false;

	if (symbolExists(name,file,section))
		return false;
	
	setFileSectionValues(name,file,section);

	SymbolKey key = { name, file, section };
	SymbolInfo value = { EquationSymbol, referenceIndex };
	symbols[key] = value;

	equationsCount++;
	return true;
}